

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

string * __thiscall
pstore::http::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(error) {
  case 1:
    pcVar2 = "Bad request";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Bad WebSocket version requested";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Not implemented";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "String too long";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Refill result out of range";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "unknown pstore::category error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string error_category::message (int const error) const {
            switch (static_cast<error_code> (error)) {
            case error_code::bad_request: return "Bad request";
            case error_code::bad_websocket_version: return "Bad WebSocket version requested";
            case error_code::not_implemented: return "Not implemented";
            case error_code::string_too_long: return "String too long";
            case error_code::refill_out_of_range: return "Refill result out of range";
            }
            return "unknown pstore::category error";
        }